

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::Node::set_motion_vector(Node *this,Vec3fa *dP)

{
  Vec3fa *in_RDX;
  Ref<embree::SceneGraph::Node> local_28;
  
  local_28.ptr = (Node *)dP;
  (**(code **)(*(long *)&dP->field_0 + 0x10))(dP);
  SceneGraph::set_motion_vector(&local_28,in_RDX);
  if (local_28.ptr != (Node *)0x0) {
    (**(code **)(*(long *)&(local_28.ptr)->super_RefCount + 0x18))();
  }
  (this->super_RefCount)._vptr_RefCount = (_func_int **)dP;
  (**(code **)(*(long *)&dP->field_0 + 0x10))(dP);
  return (Ref<embree::SceneGraph::Node>)this;
}

Assistant:

Ref<Node> set_motion_vector(const Vec3fa& dP) {
        SceneGraph::set_motion_vector(this,dP); return this;
      }